

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O0

bool __thiscall
tinyusdz::Animatable<tinyusdz::value::point3f>::get_scalar
          (Animatable<tinyusdz::value::point3f> *this,point3f *v)

{
  float fVar1;
  bool bVar2;
  point3f *v_local;
  Animatable<tinyusdz::value::point3f> *this_local;
  
  if (v == (point3f *)0x0) {
    this_local._7_1_ = false;
  }
  else {
    bVar2 = is_blocked(this);
    if (bVar2) {
      this_local._7_1_ = false;
    }
    else {
      bVar2 = has_value(this);
      if (bVar2) {
        fVar1 = (this->_value).y;
        v->x = (this->_value).x;
        v->y = fVar1;
        v->z = (this->_value).z;
        this_local._7_1_ = true;
      }
      else {
        this_local._7_1_ = false;
      }
    }
  }
  return this_local._7_1_;
}

Assistant:

bool get_scalar(T *v) const {
    if (!v) {
      return false;
    }

    if (is_blocked()) {
      return false;
    } else if (has_value()) {
      (*v) = _value;
      return true;
    }

    // timesamples
    return false;
  }